

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void __thiscall FPolyObj::ClearSubsectorLinks(FPolyObj *this)

{
  FPolyNode *pFVar1;
  FPolyNode *pFVar2;
  FPolyNode *pFVar3;
  FPolyNode *pFVar4;
  subsector_t *psVar5;
  
  pFVar3 = this->subsectorlinks;
  while( true ) {
    if (pFVar3 == (FPolyNode *)0x0) {
      this->subsectorlinks = (FPolyNode *)0x0;
      return;
    }
    if (pFVar3->state != 0x539) break;
    pFVar1 = pFVar3->pnext;
    pFVar2 = pFVar3->snext;
    if (pFVar1 == (FPolyNode *)0x0) {
      pFVar4 = pFVar3->pprev;
    }
    else {
      if (pFVar1->state != 0x539) {
        __assert_fail("subsectorlinks->pnext->state == 1337",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                      ,0x71c,"void FPolyObj::ClearSubsectorLinks()");
      }
      pFVar4 = pFVar3->pprev;
      pFVar1->pprev = pFVar4;
    }
    if (pFVar4 == (FPolyNode *)0x0) {
      psVar5 = pFVar3->subsector;
      psVar5->polys = pFVar1;
    }
    else {
      if (pFVar4->state != 0x539) {
        __assert_fail("subsectorlinks->pprev->state == 1337",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                      ,0x722,"void FPolyObj::ClearSubsectorLinks()");
      }
      pFVar4->pnext = pFVar1;
      psVar5 = pFVar3->subsector;
    }
    if (psVar5->BSP != (FMiniBSP *)0x0) {
      psVar5->BSP->bDirty = true;
    }
    pFVar3->state = -1;
    TArray<FPolySeg,_FPolySeg>::~TArray(&pFVar3->segs);
    operator_delete(pFVar3,0x40);
    this->subsectorlinks = pFVar2;
    pFVar3 = pFVar2;
  }
  __assert_fail("subsectorlinks->state == 1337",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                ,0x716,"void FPolyObj::ClearSubsectorLinks()");
}

Assistant:

void FPolyObj::ClearSubsectorLinks()
{
	while (subsectorlinks != NULL)
	{
		assert(subsectorlinks->state == 1337);

		FPolyNode *next = subsectorlinks->snext;

		if (subsectorlinks->pnext != NULL)
		{
			assert(subsectorlinks->pnext->state == 1337);
			subsectorlinks->pnext->pprev = subsectorlinks->pprev;
		}

		if (subsectorlinks->pprev != NULL)
		{
			assert(subsectorlinks->pprev->state == 1337);
			subsectorlinks->pprev->pnext = subsectorlinks->pnext;
		}
		else
		{
			subsectorlinks->subsector->polys = subsectorlinks->pnext;
		}

		if (subsectorlinks->subsector->BSP != NULL)
		{
			subsectorlinks->subsector->BSP->bDirty = true;
		}

		subsectorlinks->state = -1;
		delete subsectorlinks;
		subsectorlinks = next;
	}
	subsectorlinks = NULL;
}